

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

void Abc_AigPrintNode(Abc_Obj_t *pNode)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  Abc_Obj_t *pObj;
  char *pcVar4;
  
  pObj = (Abc_Obj_t *)((ulong)pNode & 0xfffffffffffffffe);
  uVar1 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar1 == 5) || (uVar1 == 2)) {
    pcVar2 = Abc_ObjName(pObj);
    pcVar3 = "\'";
    if (((ulong)pNode & 1) == 0) {
      pcVar3 = "";
    }
    printf("CI %4s%s.\n",pcVar2,pcVar3);
    return;
  }
  if (pObj->pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
  }
  if (uVar1 == 1) {
    pcVar2 = "(complemented)";
    if (((ulong)pNode & 1) == 0) {
      pcVar2 = "";
    }
    printf("Constant 1 %s.\n",pcVar2);
    return;
  }
  pcVar2 = Abc_ObjName(pObj);
  pcVar4 = "\'";
  pcVar3 = "\'";
  if (((ulong)pNode & 1) == 0) {
    pcVar3 = "";
  }
  printf("%7s%s",pcVar2,pcVar3);
  printf(" = ");
  pcVar2 = Abc_ObjName((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
  pcVar3 = "\'";
  if ((*(uint *)&pObj->field_0x14 >> 10 & 1) == 0) {
    pcVar3 = "";
  }
  printf("%7s%s",pcVar2,pcVar3);
  printf(" * ");
  pcVar2 = Abc_ObjName((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]]);
  if ((*(uint *)&pObj->field_0x14 >> 0xb & 1) == 0) {
    pcVar4 = "";
  }
  printf("%7s%s",pcVar2,pcVar4);
  putchar(10);
  return;
}

Assistant:

void Abc_AigPrintNode( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNodeR = Abc_ObjRegular(pNode);
    if ( Abc_ObjIsCi(pNodeR) )
    {
        printf( "CI %4s%s.\n", Abc_ObjName(pNodeR), Abc_ObjIsComplement(pNode)? "\'" : "" );
        return;
    }
    if ( Abc_AigNodeIsConst(pNodeR) )
    {
        printf( "Constant 1 %s.\n", Abc_ObjIsComplement(pNode)? "(complemented)" : ""  );
        return;
    }
    // print the node's function
    printf( "%7s%s", Abc_ObjName(pNodeR),                Abc_ObjIsComplement(pNode)? "\'" : "" );
    printf( " = " );
    printf( "%7s%s", Abc_ObjName(Abc_ObjFanin0(pNodeR)), Abc_ObjFaninC0(pNodeR)?     "\'" : "" );
    printf( " * " );
    printf( "%7s%s", Abc_ObjName(Abc_ObjFanin1(pNodeR)), Abc_ObjFaninC1(pNodeR)?     "\'" : "" );
    printf( "\n" );
}